

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitSVTest_single_word_prefix_delim_Test<char16_t>::TestBody
          (WordSplitSVTest_single_word_prefix_delim_Test<char16_t> *this)

{
  bool bVar1;
  char *pcVar2;
  reference this_00;
  AssertHelper local_e8 [8];
  Message local_e0 [12];
  int local_d4;
  size_type local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0 [12];
  int local_a4;
  size_type local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  split_result;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> single_word;
  undefined1 local_30 [8];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> word;
  WordSplitSVTest_single_word_prefix_delim_Test<char16_t> *this_local;
  
  word.field_2._8_8_ = this;
  std::__cxx11::u16string::u16string((u16string *)local_30);
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  operator+=((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             local_30,L'\0');
  make_word<char16_t,std::__cxx11::u16string>
            ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             &single_word._M_str,8,L'\0');
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  operator+=((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             local_30,(basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                       *)&single_word._M_str);
  std::__cxx11::u16string::~u16string((u16string *)&single_word._M_str);
  join_0x00000010_0x00000000_ =
       std::__cxx11::u16string::operator_cast_to_basic_string_view((u16string *)local_30);
  jessilib::word_split<std::vector,_std::basic_string_view<char16_t,_std::char_traits<char16_t>_>_>
            ((container_type_conflict4 *)&gtest_ar.message_,
             (basic_string_view<char16_t,_std::char_traits<char16_t>_> *)
             &split_result.
              super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,L'\0');
  local_a0 = std::
             vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                     *)&gtest_ar.message_);
  local_a4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_98,"split_result.size()","1",&local_a0,&local_a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  this_00 = std::
            vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
                          *)&gtest_ar.message_,0);
  local_d0 = std::__cxx11::
             basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                       (this_00);
  local_d4 = 8;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_c8,"split_result[0].size()","8",&local_d0,&local_d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=(local_e8,local_e0);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    testing::Message::~Message(local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  std::
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
             *)&gtest_ar.message_);
  std::__cxx11::u16string::~u16string((u16string *)local_30);
  return;
}

Assistant:

TYPED_TEST(WordSplitSVTest, single_word_prefix_delim) {
	std::basic_string<TypeParam> word;
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>();
	std::basic_string_view<TypeParam> single_word = word;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(single_word, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 1);
	EXPECT_EQ(split_result[0].size(), 8);
}